

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CreateSortKeyBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer *ppOVar1;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar2;
  PhysicalType type;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ScalarFunction *pSVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  int iVar7;
  reference pvVar8;
  pointer pEVar9;
  type expr;
  pointer pCVar10;
  reference this_01;
  idx_t iVar11;
  BinderException *pBVar12;
  bool bVar13;
  size_type sVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  templated_unique_single_t result;
  string sort_specifier_str;
  Value sort_specifier;
  OrderModifiers local_d2;
  _Head_base<0UL,_duckdb::CreateSortKeyBindData_*,_false> local_d0;
  string local_c8;
  Value local_a8;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = bound_function;
  local_58._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((*(int *)&(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 8U) != 0) {
    pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
    local_a8.type_._0_8_ =
         &local_a8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]"
               ,"");
    BinderException::BinderException(pBVar12,(string *)&local_a8);
    __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_d0._M_head_impl = (CreateSortKeyBindData *)operator_new(0x20);
  ((local_d0._M_head_impl)->super_FunctionData)._vptr_FunctionData = (_func_int **)0x0;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_d0._M_head_impl)->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__CreateSortKeyBindData_0249c388;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_d0._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    sVar14 = 1;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      iVar7 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
      if ((char)iVar7 == '\0') {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_a8.type_._0_8_ =
             &local_a8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"sort_specifier must be a constant value - but got %s","");
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,sVar14);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar9);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar12,(string *)&local_a8,&local_50);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar8);
      ExpressionExecutor::EvaluateScalar(&local_a8,context,expr,false);
      if (local_a8.is_null == true) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"sort_specifier cannot be NULL","");
        BinderException::BinderException(pBVar12,&local_c8);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::ToString_abi_cxx11_(&local_c8,&local_a8);
      pCVar10 = unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                ::operator->((unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                              *)&local_d0);
      local_d2 = OrderModifiers::Parse(&local_c8);
      __position._M_current =
           (pCVar10->modifiers).
           super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
           super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pCVar10->modifiers).
          super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
          super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::
        _M_realloc_insert<duckdb::OrderModifiers>
                  (&(pCVar10->modifiers).
                    super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>,
                   __position,&local_d2);
      }
      else {
        *__position._M_current = local_d2;
        ppOVar1 = &(pCVar10->modifiers).
                   super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
                   super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppOVar1 = *ppOVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      Value::~Value(&local_a8);
      sVar14 = sVar14 + 2;
    } while (sVar14 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar14 = 0;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,sVar14);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      ExpressionBinder::PushCollation(context,pvVar8,&pEVar9->return_type,ALL_COLLATIONS);
      sVar14 = sVar14 + 2;
    } while (sVar14 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar13 = true;
    sVar14 = 0;
    uVar15 = 0;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      type = (pEVar9->return_type).physical_type_;
      bVar6 = TypeIsConstantSize(type);
      if (bVar6) {
        iVar11 = GetTypeIdSize(type);
        uVar15 = uVar15 + iVar11 + 1;
      }
      else {
        bVar13 = false;
      }
      sVar14 = sVar14 + 2;
    } while (sVar14 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    if ((!bVar13) || (8 < uVar15)) goto LAB_01513a54;
  }
  LogicalType::LogicalType(&local_a8.type_,BIGINT);
  _Var5._M_pi = local_a8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar4 = local_a8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_68->super_BaseScalarFunction).return_type.id_ = local_a8.type_.id_;
  (local_68->super_BaseScalarFunction).return_type.physical_type_ = local_a8.type_.physical_type_;
  psVar2 = &(local_68->super_BaseScalarFunction).return_type.type_info_;
  uVar16 = *(undefined4 *)
            &(psVar2->internal).
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar17 = *(undefined4 *)
            ((long)&(local_68->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  pSVar3 = (ScalarFunction *)
           (psVar2->internal).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar18 = *(undefined4 *)
            &(local_68->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar19 = *(undefined4 *)
            ((long)&(local_68->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (local_68->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (local_68->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_a8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (local_68->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_68->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (local_68->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_68 = pSVar3;
    uStack_60 = uVar18;
    uStack_5c = uVar19;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar16 = (undefined4)local_68;
    uVar17 = local_68._4_4_;
    uVar18 = uStack_60;
    uVar19 = uStack_5c;
  }
  _Var5._M_pi = local_a8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_a8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uVar17,uVar16);
  local_a8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       uVar19;
  local_a8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       uVar18;
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  LogicalType::~LogicalType(&local_a8.type_);
LAB_01513a54:
  *(CreateSortKeyBindData **)
   local_58._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_d0._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_58._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> CreateSortKeyBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() % 2 != 0) {
		throw BinderException(
		    "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]");
	}
	auto result = make_uniq<CreateSortKeyBindData>();
	for (idx_t i = 1; i < arguments.size(); i += 2) {
		if (!arguments[i]->IsFoldable()) {
			throw BinderException("sort_specifier must be a constant value - but got %s", arguments[i]->ToString());
		}

		// Rebind to return a date if we are truncating that far
		Value sort_specifier = ExpressionExecutor::EvaluateScalar(context, *arguments[i]);
		if (sort_specifier.IsNull()) {
			throw BinderException("sort_specifier cannot be NULL");
		}
		auto sort_specifier_str = sort_specifier.ToString();
		result->modifiers.push_back(OrderModifiers::Parse(sort_specifier_str));
	}
	// push collations
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		ExpressionBinder::PushCollation(context, arguments[i], arguments[i]->return_type);
	}
	// check if all types are constant
	bool all_constant = true;
	idx_t constant_size = 0;
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		auto physical_type = arguments[i]->return_type.InternalType();
		if (!TypeIsConstantSize(physical_type)) {
			all_constant = false;
		} else {
			// we always add one byte for the validity
			constant_size += GetTypeIdSize(physical_type) + 1;
		}
	}
	if (all_constant) {
		if (constant_size <= sizeof(int64_t)) {
			bound_function.return_type = LogicalType::BIGINT;
		}
	}
	return std::move(result);
}